

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool MatchLabelsAgainstFilterRE
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels,vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *expressions)

{
  pointer pRVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  pointer pbVar6;
  RegularExpression *re;
  pointer this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  RegularExpressionMatch match;
  bool local_249;
  RegularExpressionMatch local_238;
  
  this = (expressions->
         super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (expressions->
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_249 = this == pRVar1;
  if (!local_249) {
    do {
      memset(&local_238,0,0x208);
      pbVar2 = (labels->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (labels->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar2 == pbVar3) {
        return local_249;
      }
      do {
        pbVar6 = pbVar2 + 1;
        bVar4 = cmsys::RegularExpression::find(this,(pbVar2->_M_dataplus)._M_p,&local_238);
        bVar5 = false;
        if (bVar4) {
          bVar5 = true;
          break;
        }
        pbVar2 = pbVar6;
      } while (pbVar6 != pbVar3);
      if (!bVar5) {
        return local_249;
      }
      this = this + 1;
      local_249 = this == pRVar1;
    } while (!local_249);
  }
  return local_249;
}

Assistant:

static bool MatchLabelsAgainstFilterRE(
  const std::vector<std::string>& labels,
  const std::vector<cmsys::RegularExpression>& expressions)
{
  for (const auto& re : expressions) {
    // check to see if the label regular expression matches
    bool found = false; // assume it does not match
    cmsys::RegularExpressionMatch match;
    // loop over all labels and look for match
    for (std::string const& l : labels) {
      if (re.find(l.c_str(), match)) {
        found = true;
        break;
      }
    }
    // if no match was found, exclude the test
    if (!found) {
      return false;
    }
  }
  return true;
}